

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::RollforwardBlock(Chainstate *this,CBlockIndex *pindex,CCoinsViewCache *inputs)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  CCoinsViewCache *in_RDX;
  ConstevalFormatString<2U> in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range3;
  CTransactionRef *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end3;
  const_iterator __begin3;
  iterator __end1;
  iterator __begin1;
  CBlock block;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  base_blob<256U> *in_stack_fffffffffffffe50;
  CBlockIndex *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  CBlock *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  CCoinsViewCache *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int nHeight;
  CTransaction *in_stack_fffffffffffffea8;
  BlockManager *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  int source_line;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar3;
  char *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  Level in_stack_fffffffffffffff0;
  
  source_line = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe4c,(AnnotatedMixin<std::recursive_mutex> *)0x7e8690);
  CBlock::CBlock(in_stack_fffffffffffffe68);
  bVar2 = ::node::BlockManager::ReadBlockFromDisk
                    (in_stack_fffffffffffffeb0,(CBlock *)in_stack_fffffffffffffea8,
                     (CBlockIndex *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  nHeight = CONCAT13(bVar2,(int3)in_stack_fffffffffffffea4);
  if (bVar2) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffffe50);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffffe50);
    while (bVar2 = __gnu_cxx::
                   operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_fffffffffffffe58,
                              (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_fffffffffffffe50), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      bVar2 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffe58);
      if (!bVar2) {
        in_stack_fffffffffffffeb0 =
             (BlockManager *)
             std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe50);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe50);
        while (bVar2 = __gnu_cxx::
                       operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   *)in_stack_fffffffffffffe58,
                                  (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   *)in_stack_fffffffffffffe50), ((bVar2 ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffffea8 =
               (CTransaction *)
               __gnu_cxx::
               __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
               operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          CCoinsViewCache::SpendCoin
                    (in_stack_fffffffffffffe78,
                     (COutPoint *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     (Coin *)in_stack_fffffffffffffe68);
          __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
          operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
      in_stack_fffffffffffffe78 = in_RDX;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_fffffffffffffe58);
      AddCoins((CCoinsViewCache *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,nHeight,
               SUB41((uint)in_stack_fffffffffffffea0 >> 0x18,0));
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    bVar3 = 1;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe60);
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffe58);
    base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe48 = 4;
    logging_function._M_str = in_stack_ffffffffffffff18;
    logging_function._M_len = in_stack_ffffffffffffff10;
    source_file._M_len._7_1_ = in_stack_ffffffffffffff07;
    source_file._M_len._0_7_ = in_stack_ffffffffffffff00;
    source_file._M_str = in_stack_ffffffffffffff08;
    LogPrintFormatInternal<int,std::__cxx11::string>
              (logging_function,source_file,source_line,(LogFlags)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffff0,in_RDI,unaff_retaddr,in_stack_00000008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    bVar3 = 0;
  }
  CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Chainstate::RollforwardBlock(const CBlockIndex* pindex, CCoinsViewCache& inputs)
{
    AssertLockHeld(cs_main);
    // TODO: merge with ConnectBlock
    CBlock block;
    if (!m_blockman.ReadBlockFromDisk(block, *pindex)) {
        LogError("ReplayBlock(): ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
        return false;
    }

    for (const CTransactionRef& tx : block.vtx) {
        if (!tx->IsCoinBase()) {
            for (const CTxIn &txin : tx->vin) {
                inputs.SpendCoin(txin.prevout);
            }
        }
        // Pass check = true as every addition may be an overwrite.
        AddCoins(inputs, *tx, pindex->nHeight, true);
    }
    return true;
}